

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O3

void __thiscall FIX::Exception::~Exception(Exception *this)

{
  ~Exception(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~Exception() NOEXCEPT {}